

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O1

LArYieldResult * __thiscall
NEST::LArNEST::LegacyCalculation
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,int pdgcode,double energy,
          double efield,double density,double track_length)

{
  int iVar1;
  LArNEST *this_00;
  double dVar2;
  double recombProb;
  double epsilon;
  undefined8 local_38;
  
  iVar1 = -pdgcode;
  if (0 < pdgcode) {
    iVar1 = pdgcode;
  }
  if (iVar1 == 0x840) {
    dVar2 = exp(energy * 0.001177689549951987 * 11.5 * -5.0);
    local_38 = (dVar2 + 1.0) * 0.23;
    dVar2 = pow(efield,0.76313);
    dVar2 = exp(dVar2 * -0.008806);
    dVar2 = dVar2 * 0.3065 + 0.69337;
  }
  else {
    local_38 = 1.0;
    dVar2 = 0.21;
  }
  this_00 = (LArNEST *)(ulong)(uint)pdgcode;
  epsilon = energy;
  recombProb = LegacyGetRecombinationProbability(this,energy,efield,density,pdgcode,track_length);
  LegacyGetYields(__return_storage_ptr__,this_00,energy,efield,local_38,dVar2,epsilon,recombProb);
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::LegacyCalculation(int pdgcode, double energy,
                                          double efield, double density,
                                          double track_length) {
  // determine various parameter values, such as the
  // yieldfactor, excitationratio, dokebirks parameters,
  // epislon and the recombination probability
  // default quenching factor, for electronic recoils
  double yieldFactor = 1.0;
  // ratio for light particle in LAr, such as e-, mu-, Aprile et. al book
  double excitationRatio = 0.21;

  // nuclear recoil quenching "L" factor: total yield is
  // reduced for nuclear recoil as per Lindhard theory
  double epsilon = 11.5 * (energy * pow(LAr_Z, (-7. / 3.)));
  if (abs(pdgcode) == 2112)  // nuclear recoil
  {
    yieldFactor = 0.23 * (1 + exp(-5 * epsilon));  // liquid argon L_eff
    excitationRatio = 0.69337 + 0.3065 * exp(-0.008806 * pow(efield, 0.76313));
  }
  // get the recombination probability
  double recombProb = LegacyGetRecombinationProbability(energy, efield, density,
                                                        pdgcode, track_length);
  return LegacyGetYields(energy, efield, yieldFactor, excitationRatio, epsilon,
                         recombProb);
}